

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetPreModel(XL *out,string *pre_model_path)

{
  HyperParam *pHVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  pHVar1 = XLearn::GetHyperParam((XLearn *)*in_RDI);
  std::__cxx11::string::operator=(in_RSI,(string *)&pHVar1->pre_model_file);
  return 0;
}

Assistant:

XL_DLL int XLearnGetPreModel(XL* out, std::string& pre_model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  pre_model_path = xl->GetHyperParam().pre_model_file;
  API_END();
}